

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_init_memory
                    (ma_dr_mp3 *pMP3,void *pData,size_t dataSize,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  long in_RDX;
  long in_RSI;
  void *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_bool32 mVar1;
  
  if (in_RDI == (void *)0x0) {
    mVar1 = 0;
  }
  else {
    memset(in_RDI,0,0x3ec0);
    if ((in_RSI == 0) || (in_RDX == 0)) {
      mVar1 = 0;
    }
    else {
      *(long *)((long)in_RDI + 0x3ea8) = in_RSI;
      *(long *)((long)in_RDI + 0x3eb0) = in_RDX;
      *(undefined8 *)((long)in_RDI + 0x3eb8) = 0;
      mVar1 = ma_dr_mp3_init_internal
                        (pMP3,(ma_dr_mp3_read_proc)pData,(ma_dr_mp3_seek_proc)dataSize,
                         pAllocationCallbacks,
                         (ma_allocation_callbacks *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_init_memory(ma_dr_mp3* pMP3, const void* pData, size_t dataSize, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    MA_DR_MP3_ZERO_OBJECT(pMP3);
    if (pData == NULL || dataSize == 0) {
        return MA_FALSE;
    }
    pMP3->memory.pData = (const ma_uint8*)pData;
    pMP3->memory.dataSize = dataSize;
    pMP3->memory.currentReadPos = 0;
    return ma_dr_mp3_init_internal(pMP3, ma_dr_mp3__on_read_memory, ma_dr_mp3__on_seek_memory, pMP3, pAllocationCallbacks);
}